

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::makeBlurEffectIfNeeded(AbstractScrollAreaPrivate *this)

{
  int iVar1;
  QPoint QVar2;
  long lVar3;
  BlurEffect *pBVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  int local_40;
  
  if (this->horBlur->policy != BlurAlwaysOff) {
    QVar2 = this->topLeftCorner;
    normalizePosition(this);
    lVar3 = *(long *)(this->viewport + 0x20);
    iVar10 = ~*(uint *)(lVar3 + 0x1c) + *(int *)(lVar3 + 0x14) + (this->scrolledAreaSize).wd;
    iVar8 = ~*(uint *)(lVar3 + 0x20) + *(int *)(lVar3 + 0x18) + (this->scrolledAreaSize).ht;
    iVar9 = QVar2.xp;
    if ((iVar9 < 0) || ((this->horBlur->pressure < 0 && (iVar9 <= iVar10)))) {
      pBVar4 = this->horBlur;
      iVar1 = pBVar4->pressure;
      iVar5 = iVar1 + iVar9;
      iVar7 = 0;
      if (0 < iVar1 || iVar5 < 1) {
        iVar6 = -iVar5;
        if (0 < iVar5) {
          iVar6 = iVar5;
        }
        dVar11 = pBVar4->maxPressure;
        iVar7 = iVar5;
        if (dVar11 < (double)iVar6) {
          if (iVar1 < 0) {
            dVar11 = -dVar11;
          }
          iVar7 = (int)dVar11;
        }
      }
      pBVar4->pressure = iVar7;
      QWidget::move((QPoint *)pBVar4);
    }
    local_40 = QVar2.yp;
    if (((long)QVar2 < 0) || ((this->vertBlur->pressure < 0 && (local_40 <= iVar8)))) {
      pBVar4 = this->vertBlur;
      iVar1 = pBVar4->pressure;
      iVar7 = local_40 + iVar1;
      if ((0 < iVar1) || (iVar5 = 0, iVar7 < 1)) {
        iVar6 = -iVar7;
        if (0 < iVar7) {
          iVar6 = iVar7;
        }
        dVar11 = pBVar4->maxPressure;
        iVar5 = iVar7;
        if (dVar11 < (double)iVar6) {
          if (iVar1 < 0) {
            dVar11 = -dVar11;
          }
          iVar5 = (int)dVar11;
        }
      }
      pBVar4->pressure = iVar5;
      QWidget::move((QPoint *)pBVar4);
    }
    if ((iVar9 - iVar10 != 0 && iVar10 <= iVar9) || ((0 < iVar9 && (0 < this->horBlur->pressure))))
    {
      pBVar4 = this->horBlur;
      iVar1 = pBVar4->pressure;
      if ((iVar1 < 0) || (iVar7 = 0, iVar10 <= iVar1 + iVar9)) {
        iVar7 = (iVar9 - iVar10) + iVar1;
        iVar9 = -iVar7;
        if (0 < iVar7) {
          iVar9 = iVar7;
        }
        dVar11 = pBVar4->maxPressure;
        if (dVar11 < (double)iVar9) {
          if (iVar1 < 0) {
            dVar11 = -dVar11;
          }
          iVar7 = (int)dVar11;
        }
      }
      pBVar4->pressure = iVar7;
      QWidget::move((QPoint *)pBVar4);
    }
    if ((local_40 - iVar8 != 0 && iVar8 <= local_40) ||
       (0 < local_40 && 0 < this->vertBlur->pressure)) {
      pBVar4 = this->vertBlur;
      iVar9 = pBVar4->pressure;
      if ((iVar9 < 0) || (iVar10 = 0, iVar8 <= local_40 + iVar9)) {
        iVar10 = (local_40 - iVar8) + iVar9;
        iVar8 = -iVar10;
        if (0 < iVar10) {
          iVar8 = iVar10;
        }
        dVar11 = pBVar4->maxPressure;
        if (dVar11 < (double)iVar8) {
          if (iVar9 < 0) {
            dVar11 = -dVar11;
          }
          iVar10 = (int)dVar11;
        }
      }
      pBVar4->pressure = iVar10;
      QWidget::move((QPoint *)pBVar4);
    }
    if (this->horBlur->pressure == 0) {
      QWidget::hide();
    }
    else {
      QWidget::raise();
      QWidget::show();
      QWidget::update();
    }
    if (this->vertBlur->pressure == 0) {
      QWidget::hide();
    }
    else {
      QWidget::raise();
      QWidget::show();
      QWidget::update();
    }
    return;
  }
  normalizePosition(this);
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::makeBlurEffectIfNeeded()
{
	if( horBlur->policy != AbstractScrollArea::BlurAlwaysOff )
	{
		const QRect r = viewport->rect();

		const QPoint p = topLeftCorner;

		normalizePosition();

		const QSize s = viewport->size();

		const QPoint maxPos = QPoint( scrolledAreaSize.width() - s.width(),
			scrolledAreaSize.height() - s.height() );

		if( p.x() < 0 || ( horBlur->pressure < 0 && maxPos.x() >= p.x() ) )
		{
			if( horBlur->pressure <= 0 && horBlur->pressure + p.x() > 0 )
				horBlur->pressure = 0;
			else if( qAbs( horBlur->pressure + p.x() ) > horBlur->maxPressure )
				horBlur->pressure = ( horBlur->pressure < 0 ?
					- horBlur->maxPressure : horBlur->maxPressure );
			else
				horBlur->pressure += p.x();

			horBlur->move(
				( horBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					- horBlur->width() / 2,
				( horBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ ( r.height() - horBlur->height() ) / 2 );
		}

		if( p.y() < 0 || ( vertBlur->pressure < 0 && maxPos.y() >= p.y() ) )
		{
			if( vertBlur->pressure <= 0 && vertBlur->pressure + p.y() > 0 )
				vertBlur->pressure = 0;
			else if( qAbs( vertBlur->pressure + p.y() ) > vertBlur->maxPressure )
				vertBlur->pressure = ( vertBlur->pressure < 0 ?
					- vertBlur->maxPressure : vertBlur->maxPressure );
			else
				vertBlur->pressure += p.y();

			vertBlur->move(
				( vertBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ ( r.width() - vertBlur->width() ) / 2,
				( vertBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					- vertBlur->height() / 2 );
		}

		if( maxPos.x() < p.x() || ( horBlur->pressure > 0 && p.x() > 0 ) )
		{
			if( horBlur->pressure >= 0 &&
				horBlur->pressure + p.x() - maxPos.x() < 0 )
					horBlur->pressure = 0;
			else if( qAbs( horBlur->pressure + p.x() - maxPos.x() ) > horBlur->maxPressure )
				horBlur->pressure = ( horBlur->pressure < 0 ?
					- horBlur->maxPressure : horBlur->maxPressure );
			else
				horBlur->pressure += ( p.x() - maxPos.x() );

			horBlur->move(
				( horBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ r.width() - horBlur->width() / 2,
				( horBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ ( r.height() - horBlur->height() ) / 2 );
		}

		if( maxPos.y() < p.y() || ( vertBlur->pressure > 0 && p.y() > 0 ) )
		{
			if( vertBlur->pressure >= 0 &&
				vertBlur->pressure + p.y() - maxPos.y() < 0 )
					vertBlur->pressure = 0;
			else if( qAbs( vertBlur->pressure + p.y() - maxPos.y() ) > vertBlur->maxPressure )
				vertBlur->pressure = ( vertBlur->pressure < 0 ?
					- vertBlur->maxPressure : vertBlur->maxPressure );
			else
				vertBlur->pressure += ( p.y() - maxPos.y() );

			vertBlur->move(
				( vertBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ ( r.width() - vertBlur->width() ) / 2,
				( vertBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ r.height() - vertBlur->height() / 2 );
		}

		if( horBlur->pressure != 0 )
		{
			horBlur->raise();
			horBlur->show();
			horBlur->update();
		}
		else
			horBlur->hide();

		if( vertBlur->pressure != 0 )
		{
			vertBlur->raise();
			vertBlur->show();
			vertBlur->update();
		}
		else
			vertBlur->hide();
	}
	else
		normalizePosition();
}